

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O3

void patchlistaux(FuncState *fs,int list,int vtarget,int reg,int dtarget)

{
  int iVar1;
  int dest;
  uint uVar2;
  
  if (list != -1) {
    do {
      uVar2 = (uint)*(ushort *)((long)fs->f->code + (long)list * 4 + 2);
      iVar1 = patchtestreg(fs,list,reg);
      dest = vtarget;
      if (iVar1 == 0) {
        dest = dtarget;
      }
      fixjump(fs,list,dest);
    } while ((uVar2 != 0x7fff) && (list = list + -0x7fff + uVar2, list != -1));
  }
  return;
}

Assistant:

static void patchlistaux (FuncState *fs, int list, int vtarget, int reg,
                          int dtarget) {
  while (list != NO_JUMP) {
    int next = getjump(fs, list);
    if (patchtestreg(fs, list, reg))
      fixjump(fs, list, vtarget);  /* Jump to target with value. */
    else
      fixjump(fs, list, dtarget);  /* jump to default target */
    list = next;
  }
}